

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktBindingShaderAccessTests.cpp
# Opt level: O3

TestStatus * __thiscall
vkt::BindingModel::anon_unknown_1::TexelBufferRenderInstance::verifyResultImage
          (TestStatus *__return_storage_ptr__,TexelBufferRenderInstance *this,
          ConstPixelBufferAccess *result)

{
  TextureFormat TVar1;
  TestLog *log;
  bool bVar2;
  int x;
  int x_00;
  void *data;
  ConstPixelBufferAccess *texelSrc;
  int x_01;
  Surface reference;
  Vec4 sample3;
  Vec4 sample2;
  Vec4 sample1;
  Vec4 sample0;
  ConstPixelBufferAccess local_b0;
  TextureFormat local_88;
  Surface local_80;
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  Vec4 local_48;
  TextureFormat local_38;
  int aiStack_30 [2];
  
  if (this->m_stageFlags == 0) {
    local_38.order = 0x3f800000;
    local_38.type = 0x3f800000;
    aiStack_30[0] = 0;
    aiStack_30[1] = 0x3f800000;
    local_48.m_data[0] = 0.0;
    local_48.m_data[1] = 1.0;
    local_48.m_data[2] = 0.0;
    local_48.m_data[3] = 1.0;
    local_58._0_4_ = R;
    local_58._4_4_ = 0x3f800000;
    local_58._8_4_ = 0;
    local_58._12_4_ = 0x3f800000;
    local_68._0_4_ = 0x3f800000;
    local_68._4_4_ = 0x3f800000;
    local_68._8_4_ = 0;
    local_68._12_4_ = 0x3f800000;
  }
  else {
    x = (int)this + 0x220;
    tcu::ConstPixelBufferAccess::getPixel((ConstPixelBufferAccess *)&local_38,x,6,0);
    x_01 = (int)this + 0x248;
    x_00 = x_01;
    if ((this->m_texelBuffers).m_numTexelBuffers == 1) {
      x_00 = x;
    }
    tcu::ConstPixelBufferAccess::getPixel((ConstPixelBufferAccess *)&local_48,x_00,0x33,0);
    tcu::ConstPixelBufferAccess::getPixel((ConstPixelBufferAccess *)local_58,x,0x2a,0);
    if ((this->m_texelBuffers).m_numTexelBuffers == 1) {
      x_01 = x;
    }
    tcu::ConstPixelBufferAccess::getPixel((ConstPixelBufferAccess *)local_68,x_01,0x19,0);
  }
  tcu::Surface::Surface
            (&local_80,
             (this->super_SingleCmdRenderInstance).super_SingleTargetRenderInstance.m_targetSize.
             m_data[0],
             (this->super_SingleCmdRenderInstance).super_SingleTargetRenderInstance.m_targetSize.
             m_data[1]);
  local_88.order = RGBA;
  local_88.type = UNORM_INT8;
  data = (void *)local_80.m_pixels.m_cap;
  if ((void *)local_80.m_pixels.m_cap != (void *)0x0) {
    data = local_80.m_pixels.m_ptr;
  }
  tcu::PixelBufferAccess::PixelBufferAccess
            ((PixelBufferAccess *)&local_b0,&local_88,local_80.m_width,local_80.m_height,1,data);
  drawQuadrantReferenceResult
            ((PixelBufferAccess *)&local_b0,(Vec4 *)&local_38,&local_48,(Vec4 *)local_58,
             (Vec4 *)local_68);
  log = ((this->super_SingleCmdRenderInstance).super_SingleTargetRenderInstance.super_TestInstance.
        m_context)->m_testCtx->m_log;
  local_88.order = RGBA;
  local_88.type = UNORM_INT8;
  if ((void *)local_80.m_pixels.m_cap != (void *)0x0) {
    local_80.m_pixels.m_cap = (size_t)local_80.m_pixels.m_ptr;
  }
  tcu::PixelBufferAccess::PixelBufferAccess
            ((PixelBufferAccess *)&local_b0,&local_88,local_80.m_width,local_80.m_height,1,
             (void *)local_80.m_pixels.m_cap);
  bVar2 = tcu::bilinearCompare
                    (log,"Compare","Result comparison",&local_b0,result,(RGBA)0x1010101,
                     COMPARE_LOG_RESULT);
  TVar1 = (TextureFormat)(local_b0.m_size.m_data + 2);
  local_b0.m_format = TVar1;
  if (bVar2) {
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"Pass","");
    __return_storage_ptr__->m_code = QP_TEST_RESULT_PASS;
    (__return_storage_ptr__->m_description)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->m_description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&__return_storage_ptr__->m_description,local_b0.m_format,
               (undefined1 *)(local_b0.m_size.m_data._0_8_ + (long)local_b0.m_format));
  }
  else {
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_b0,"Image verification failed","");
    __return_storage_ptr__->m_code = QP_TEST_RESULT_FAIL;
    (__return_storage_ptr__->m_description)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->m_description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&__return_storage_ptr__->m_description,local_b0.m_format,
               (undefined1 *)(local_b0.m_size.m_data._0_8_ + (long)local_b0.m_format));
  }
  if (local_b0.m_format != TVar1) {
    operator_delete((void *)local_b0.m_format,local_b0._16_8_ + 1);
  }
  tcu::Surface::~Surface(&local_80);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus TexelBufferRenderInstance::verifyResultImage (const tcu::ConstPixelBufferAccess& result) const
{
	const tcu::Vec4		green		(0.0f, 1.0f, 0.0f, 1.0f);
	const tcu::Vec4		yellow		(1.0f, 1.0f, 0.0f, 1.0f);
	const bool			doFetch		= (m_stageFlags != 0u); // no active stages? Then don't fetch
	const tcu::Vec4		sample0		= (!doFetch) ? (yellow)	: (m_texelBuffers.fetchTexelValue(0));
	const tcu::Vec4		sample1		= (!doFetch) ? (green)	: (m_texelBuffers.fetchTexelValue(1));
	const tcu::Vec4		sample2		= (!doFetch) ? (green)	: (m_texelBuffers.fetchTexelValue(2));
	const tcu::Vec4		sample3		= (!doFetch) ? (yellow)	: (m_texelBuffers.fetchTexelValue(3));
	tcu::Surface		reference	(m_targetSize.x(), m_targetSize.y());

	drawQuadrantReferenceResult(reference.getAccess(), sample0, sample1, sample2, sample3);

	if (!bilinearCompare(m_context.getTestContext().getLog(), "Compare", "Result comparison", reference.getAccess(), result, tcu::RGBA(1, 1, 1, 1), tcu::COMPARE_LOG_RESULT))
		return tcu::TestStatus::fail("Image verification failed");
	else
		return tcu::TestStatus::pass("Pass");
}